

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::cancel_wait(NonblockingNotifierV2 *this,Waiter *param_2)

{
  ulong uVar1;
  ulong *in_RDI;
  uint64_t newstate;
  uint64_t state;
  memory_order __b;
  memory_order in_stack_fffffffffffffe34;
  ulong local_88;
  ulong local_80 [3];
  ulong local_68;
  memory_order local_60;
  int local_5c;
  undefined4 local_4c;
  ulong local_48;
  ulong *local_40;
  bool local_29;
  ulong local_28;
  memory_order local_20;
  undefined4 local_1c;
  ulong local_18;
  ulong *local_10;
  
  local_5c = 0;
  local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_5c - 1U < 2) {
    local_68 = *in_RDI;
  }
  else if (local_5c == 5) {
    local_68 = *in_RDI;
  }
  else {
    local_68 = *in_RDI;
  }
  local_80[0] = local_68;
  do {
    local_88 = local_80[0] - 0x4000;
    if ((local_80[0] & 0xfffc000) >> 0xe == (local_80[0] & 0x3fff0000000) >> 0x1c) {
      local_88 = local_80[0] - 0x10004000;
    }
    local_48 = local_88;
    local_4c = 4;
    local_40 = local_80;
    local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffe34);
    local_18 = local_88;
    local_1c = 4;
    local_28 = local_88;
    switch(0x184709) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        in_stack_fffffffffffffe34 = CONCAT13(local_29,(int3)in_stack_fffffffffffffe34);
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
      else {
        LOCK();
        uVar1 = *in_RDI;
        local_29 = local_80[0] == uVar1;
        if (local_29) {
          *in_RDI = local_88;
          uVar1 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = uVar1;
        }
      }
    }
    local_10 = local_80;
  } while (local_29 == false);
  return;
}

Assistant:

void cancel_wait(Waiter*) {
    uint64_t state = _state.load(std::memory_order_relaxed);
    for (;;) {
      //_check_state(state, true);
      uint64_t newstate = state - kWaiterInc;
      // We don't know if the thread was also notified or not,
      // so we should not consume a signal unconditionally.
      // Only if number of waiters is equal to number of signals,
      // we know that the thread was notified and we must take away the signal.
      if (((state & kWaiterMask) >> kWaiterShift) == ((state & kSignalMask) >> kSignalShift)) newstate -= kSignalInc;
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) return;
    }
  }